

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstorageinfo_linux.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1230377::AutoFileDescriptor::AutoFileDescriptor
          (AutoFileDescriptor *this,QString *path,int mode)

{
  long lVar1;
  int iVar2;
  int *in_RDI;
  long in_FS_OFFSET;
  mode_t in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  char *in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QFile::encodeName((QString *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  QByteArray::operator_cast_to_char_((QByteArray *)0x7e12b8);
  iVar2 = qt_safe_open(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88
                      );
  QByteArray::~QByteArray((QByteArray *)0x7e12e2);
  *in_RDI = iVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

AutoFileDescriptor(const QString &path, int mode = QT_OPEN_RDONLY)
        : fd(qt_safe_open(QFile::encodeName(path), mode))
    {}